

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneInfo::Load(TimeZoneInfo *this,ZoneInfoSource *zip)

{
  vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
  *this_00;
  vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
  *this_01;
  undefined8 *puVar1;
  byte bVar2;
  uint_least8_t uVar3;
  const_iterator cVar4;
  pointer pTVar5;
  char acVar6 [1];
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  iterator iVar11;
  uint_least8_t *puVar12;
  ulong uVar13;
  bool *pbVar14;
  size_type sVar15;
  byte *pbVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  TransitionType *tt_00;
  TransitionType *tt;
  pointer pTVar21;
  pointer pTVar22;
  long lVar23;
  fields fVar24;
  uchar ch;
  Header hdr;
  vector<char,_std::allocator<char>_> tbuf;
  tzhead tzh;
  absolute_lookup local_d0;
  ulong local_b0;
  Header local_a8;
  vector<char,_std::allocator<char>_> local_78;
  tzhead local_5c;
  
  iVar9 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_5c,0x2c);
  if (CONCAT44(extraout_var,iVar9) != 0x2c) {
    return false;
  }
  if (local_5c.tzh_magic != (char  [4])0x66695a54) {
    return false;
  }
  bVar7 = anon_unknown_0::Header::Build(&local_a8,&local_5c);
  acVar6[0] = local_5c.tzh_version[0];
  if (!bVar7) {
    return false;
  }
  if (local_5c.tzh_version[0] == '\0') {
    uVar17 = 4;
  }
  else {
    iVar9 = (*zip->_vptr_ZoneInfoSource[3])
                      (zip,local_a8.timecnt * 5 + local_a8.typecnt * 6 + local_a8.charcnt +
                           local_a8.leapcnt * 8 + local_a8.ttisstdcnt + local_a8.ttisutcnt);
    if (iVar9 != 0) {
      return false;
    }
    iVar9 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_5c,0x2c);
    if (CONCAT44(extraout_var_00,iVar9) != 0x2c) {
      return false;
    }
    if (local_5c.tzh_magic != (char  [4])0x66695a54) {
      return false;
    }
    if (local_5c.tzh_version[0] == '\0') {
      return false;
    }
    bVar7 = anon_unknown_0::Header::Build(&local_a8,&local_5c);
    uVar17 = 8;
    if (!bVar7) {
      return false;
    }
  }
  if ((((local_a8.typecnt == 0) || (local_a8.leapcnt != 0)) ||
      (local_a8.ttisstdcnt != 0 && local_a8.ttisstdcnt != local_a8.typecnt)) ||
     (local_a8.ttisutcnt != 0 && local_a8.ttisutcnt != local_a8.typecnt)) {
    return false;
  }
  local_b0 = local_a8.charcnt;
  sVar15 = local_a8.ttisstdcnt + local_a8.typecnt * 6 + local_a8.ttisutcnt +
           (uVar17 | 1) * local_a8.timecnt + local_a8.charcnt;
  std::vector<char,_std::allocator<char>_>::vector(&local_78,sVar15,(allocator_type *)&local_d0);
  iVar9 = (*zip->_vptr_ZoneInfoSource[2])
                    (zip,local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar15);
  pbVar16 = (byte *)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  if (CONCAT44(extraout_var_01,iVar9) == sVar15) {
    this_00 = &this->transitions_;
    std::
    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ::reserve(this_00,local_a8.timecnt + 2);
    std::
    vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
    ::resize(this_00,local_a8.timecnt);
    bVar7 = local_a8.timecnt == 0;
    if (!bVar7) {
      pTVar21 = (this_00->
                super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar15 = 0;
      do {
        if (acVar6[0] == '\0') {
          lVar19 = 0;
          uVar13 = 0;
          do {
            uVar20 = uVar13 << 8;
            uVar13 = pbVar16[lVar19] | uVar20;
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 != 4);
          uVar18 = uVar13 - 0x100000000;
          if (uVar20 >> 0x1f == 0) {
            uVar18 = uVar13;
          }
        }
        else {
          lVar19 = 0;
          uVar18 = 0;
          do {
            uVar18 = uVar18 << 8 | (ulong)pbVar16[lVar19];
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 != 8);
        }
        pTVar21[sVar15].unix_time = uVar18;
        pbVar16 = pbVar16 + uVar17;
        if ((sVar15 != 0) && ((long)uVar18 <= pTVar21[sVar15 - 1].unix_time)) break;
        sVar15 = sVar15 + 1;
        bVar7 = sVar15 == local_a8.timecnt;
      } while (!bVar7);
    }
    if (bVar7) {
      bVar7 = local_a8.timecnt == 0;
      if (bVar7) {
LAB_00399585:
        bVar8 = 0;
      }
      else {
        pTVar21 = (this_00->
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        bVar8 = *pbVar16;
        uVar13 = (ulong)bVar8;
        pbVar16 = pbVar16 + 1;
        pTVar21->type_index = bVar8;
        if (local_a8.typecnt <= uVar13) goto LAB_00399585;
        puVar12 = &pTVar21[1].type_index;
        bVar8 = 0;
        sVar15 = local_a8.timecnt;
        do {
          sVar15 = sVar15 - 1;
          if ((char)uVar13 == '\0') {
            bVar8 = 1;
          }
          bVar7 = sVar15 == 0;
          if (bVar7) break;
          bVar2 = *pbVar16;
          uVar13 = (ulong)bVar2;
          pbVar16 = pbVar16 + 1;
          *puVar12 = bVar2;
          puVar12 = puVar12 + 0x30;
        } while (uVar13 < local_a8.typecnt);
      }
      if (bVar7) {
        this_01 = &this->transition_types_;
        std::
        vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
        ::reserve(this_01,local_a8.typecnt + 2);
        std::
        vector<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
        ::resize(this_01,local_a8.typecnt);
        pTVar22 = (this_01->
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        bVar7 = false;
        uVar13 = 0;
        do {
          lVar19 = 0;
          uVar10 = 0;
          do {
            uVar10 = (uint)pbVar16[lVar19] | uVar10 << 8;
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 != 4);
          pTVar22[uVar13].utc_offset = uVar10;
          if (uVar10 - 0x15180 < 0xfffd5d01) break;
          pTVar22[uVar13].is_dst = pbVar16[4] != 0;
          bVar2 = pbVar16[5];
          pbVar16 = pbVar16 + 6;
          pTVar22[uVar13].abbr_index = bVar2;
          if (local_b0 <= bVar2) break;
          uVar13 = uVar13 + 1;
          bVar7 = uVar13 == local_a8.typecnt;
        } while (!bVar7);
        if (bVar7) {
          this->default_transition_type_ = '\0';
          if (!(bool)(~bVar8 & 1) && local_a8.timecnt != 0) {
            pTVar22 = (this_01->
                      super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (pTVar22->is_dst == true) {
              bVar8 = ((this_00->
                       super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                       )._M_impl.super__Vector_impl_data._M_start)->type_index;
              if (bVar8 == 0) goto LAB_0039967c;
              pbVar14 = &pTVar22->is_dst + (uint)bVar8 * 0x30;
              do {
                if (*pbVar14 != true) goto LAB_0039967c;
                bVar8 = bVar8 - 1;
                pbVar14 = pbVar14 + -0x30;
              } while (bVar8 != 0);
            }
            bVar8 = 0;
LAB_0039967c:
            do {
              if (local_a8.typecnt == bVar8) break;
              if ((&pTVar22->is_dst)[(uint)bVar8 * 0x30] != true) {
                if (local_a8.typecnt != bVar8) {
                  this->default_transition_type_ = bVar8;
                }
                break;
              }
              bVar8 = bVar8 + 1;
            } while( true );
          }
          std::__cxx11::string::reserve((ulong)&this->abbreviations_);
          std::__cxx11::string::_M_replace
                    ((ulong)&this->abbreviations_,0,(char *)(this->abbreviations_)._M_string_length,
                     (ulong)pbVar16);
          if (pbVar16 + local_a8.ttisutcnt +
                        local_a8.ttisstdcnt + (uVar17 + 4) * local_a8.leapcnt + local_a8.charcnt !=
              (byte *)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
            __assert_fail("bp == tbuf.data() + tbuf.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                          ,0x2d9,
                          "bool absl::time_internal::cctz::TimeZoneInfo::Load(ZoneInfoSource *)");
          }
          (this->future_spec_)._M_string_length = 0;
          *(this->future_spec_)._M_dataplus._M_p = '\0';
          if (local_5c.tzh_version[0] == '\0') {
LAB_003997ae:
            if ((this->version_)._M_string_length == 0) {
              (*zip->_vptr_ZoneInfoSource[4])(&local_d0,zip);
              std::__cxx11::string::operator=((string *)&this->version_,(string *)&local_d0);
              if ((int *)CONCAT71(local_d0.cs.f_.y._1_7_,(byte)local_d0.cs.f_.y) != &local_d0.offset
                 ) {
                operator_delete((undefined1 *)
                                CONCAT71(local_d0.cs.f_.y._1_7_,(byte)local_d0.cs.f_.y),
                                local_d0._16_8_ + 1);
              }
            }
            cVar4._M_current =
                 (this->transitions_).
                 super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if ((cVar4._M_current ==
                 (this->transitions_).
                 super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                 ._M_impl.super__Vector_impl_data._M_finish) || (-1 < (cVar4._M_current)->unix_time)
               ) {
              iVar11 = std::
                       vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                       ::_M_emplace_aux<>(this_00,cVar4);
              (iVar11._M_current)->unix_time = -0x800000000000000;
              (iVar11._M_current)->type_index = this->default_transition_type_;
            }
            bVar7 = ExtendTransitions(this);
            if (bVar7) {
              cVar4._M_current =
                   (this->transitions_).
                   super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (cVar4._M_current[-1].unix_time < 0) {
                uVar3 = cVar4._M_current[-1].type_index;
                iVar11 = std::
                         vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                         ::_M_emplace_aux<>(this_00,cVar4);
                (iVar11._M_current)->unix_time = 0x7fffffff;
                (iVar11._M_current)->type_index = uVar3;
              }
              pTVar21 = (this->transitions_).
                        super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar7 = (this->transitions_).
                      super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                      ._M_impl.super__Vector_impl_data._M_finish == pTVar21;
              if (!bVar7) {
                tt_00 = (TransitionType *)
                        ((long)&((this->transition_types_).
                                 super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->utc_offset +
                        (ulong)((uint)this->default_transition_type_ * 0x30));
                lVar19 = 0x10;
                lVar23 = 0;
                do {
                  LocalTime(&local_d0,this,*(int_fast64_t *)((long)pTVar21 + lVar19 + -0x10),tt_00);
                  fVar24 = detail::step(CONCAT71(local_d0.cs.f_.y._1_7_,(byte)local_d0.cs.f_.y),
                                        local_d0.cs.f_._8_8_,0xffffffffffffffff);
                  *(int_least64_t *)((long)&(pTVar21->civil_sec).f_.y + lVar19) = fVar24.y;
                  *(ulong *)(&(pTVar21->civil_sec).f_.m + lVar19) = fVar24._8_8_ & 0xffffffffff;
                  tt_00 = (TransitionType *)
                          ((long)&((this->transition_types_).
                                   super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->utc_offset +
                          (ulong)((uint)*(byte *)((long)pTVar21 + lVar19 + -8) * 0x30));
                  LocalTime(&local_d0,this,*(int_fast64_t *)((long)pTVar21 + lVar19 + -0x10),tt_00);
                  puVar1 = (undefined8 *)((long)&pTVar21->unix_time + lVar19);
                  *puVar1 = CONCAT71(local_d0.cs.f_.y._1_7_,(byte)local_d0.cs.f_.y);
                  puVar1[1] = local_d0.cs.f_._8_8_;
                  if ((lVar23 != 0) &&
                     (bVar7 = detail::operator<((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                                 *)((long)&(this_00->
                                                                                                                      
                                                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[-1].
                                                  unix_time + lVar19),
                                                (civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                                 *)((long)&pTVar21->unix_time + lVar19)), !bVar7))
                  goto LAB_003999bf;
                  lVar23 = lVar23 + 1;
                  pTVar21 = (this->transitions_).
                            super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar19 = lVar19 + 0x30;
                  bVar7 = lVar23 == ((long)(this->transitions_).
                                           super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pTVar21 >> 4) * -0x5555555555555555;
                } while (!bVar7);
              }
              pTVar22 = (this->transition_types_).
                        super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pTVar5 = (this->transition_types_).
                       super__Vector_base<absl::lts_20250127::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20250127::time_internal::cctz::TransitionType>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (pTVar22 != pTVar5) {
                do {
                  LocalTime(&local_d0,this,0x7fffffffffffffff,pTVar22);
                  (pTVar22->civil_max).f_.y =
                       CONCAT71(local_d0.cs.f_.y._1_7_,(byte)local_d0.cs.f_.y);
                  (pTVar22->civil_max).f_.m = local_d0.cs.f_.m;
                  (pTVar22->civil_max).f_.d = local_d0.cs.f_.d;
                  (pTVar22->civil_max).f_.hh = local_d0.cs.f_.hh;
                  (pTVar22->civil_max).f_.mm = local_d0.cs.f_.mm;
                  (pTVar22->civil_max).f_.ss = local_d0.cs.f_.ss;
                  *(undefined3 *)&(pTVar22->civil_max).f_.field_0xd = local_d0.cs.f_._13_3_;
                  LocalTime(&local_d0,this,-0x8000000000000000,pTVar22);
                  (pTVar22->civil_min).f_.y =
                       CONCAT71(local_d0.cs.f_.y._1_7_,(byte)local_d0.cs.f_.y);
                  (pTVar22->civil_min).f_.m = local_d0.cs.f_.m;
                  (pTVar22->civil_min).f_.d = local_d0.cs.f_.d;
                  (pTVar22->civil_min).f_.hh = local_d0.cs.f_.hh;
                  (pTVar22->civil_min).f_.mm = local_d0.cs.f_.mm;
                  (pTVar22->civil_min).f_.ss = local_d0.cs.f_.ss;
                  *(undefined3 *)&(pTVar22->civil_min).f_.field_0xd = local_d0.cs.f_._13_3_;
                  pTVar22 = pTVar22 + 1;
                } while (pTVar22 != pTVar5);
              }
              if ((this->transitions_).
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                  (this->transitions_).
                  super__Vector_base<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                __shrink_to_fit_aux<std::vector<absl::lts_20250127::time_internal::cctz::Transition,_std::allocator<absl::lts_20250127::time_internal::cctz::Transition>_>,_true>
                ::_S_do_it(this_00);
              }
              goto LAB_003999c1;
            }
          }
          else {
            iVar9 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_d0,1);
            bVar7 = false;
            if ((CONCAT44(extraout_var_02,iVar9) != 1) || ((byte)local_d0.cs.f_.y != 10))
            goto LAB_003999c1;
            iVar9 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_d0,1);
            uVar10 = 0xffffffff;
            if (CONCAT44(extraout_var_03,iVar9) == 1) {
              uVar10 = (uint)(byte)local_d0.cs.f_.y;
            }
            while (uVar10 != 0xffffffff) {
              if (uVar10 == 10) goto LAB_003997ae;
              std::__cxx11::string::push_back((char)this + -0x80);
              iVar9 = (*zip->_vptr_ZoneInfoSource[2])(zip,&local_d0,1);
              if (CONCAT44(extraout_var_04,iVar9) == 1) {
                uVar10 = (uint)(byte)local_d0.cs.f_.y;
              }
              else {
                uVar10 = 0xffffffff;
              }
            }
          }
        }
      }
    }
  }
LAB_003999bf:
  bVar7 = false;
LAB_003999c1:
  if ((byte *)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool TimeZoneInfo::Load(ZoneInfoSource* zip) {
  // Read and validate the header.
  tzhead tzh;
  if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
  if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
    return false;
  Header hdr;
  if (!hdr.Build(tzh)) return false;
  std::size_t time_len = 4;
  if (tzh.tzh_version[0] != '\0') {
    // Skip the 4-byte data.
    if (zip->Skip(hdr.DataLength(time_len)) != 0) return false;
    // Read and validate the header for the 8-byte data.
    if (zip->Read(&tzh, sizeof(tzh)) != sizeof(tzh)) return false;
    if (strncmp(tzh.tzh_magic, TZ_MAGIC, sizeof(tzh.tzh_magic)) != 0)
      return false;
    if (tzh.tzh_version[0] == '\0') return false;
    if (!hdr.Build(tzh)) return false;
    time_len = 8;
  }
  if (hdr.typecnt == 0) return false;
  if (hdr.leapcnt != 0) {
    // This code assumes 60-second minutes so we do not want
    // the leap-second encoded zoneinfo. We could reverse the
    // compensation, but the "right" encoding is rarely used
    // so currently we simply reject such data.
    return false;
  }
  if (hdr.ttisstdcnt != 0 && hdr.ttisstdcnt != hdr.typecnt) return false;
  if (hdr.ttisutcnt != 0 && hdr.ttisutcnt != hdr.typecnt) return false;

  // Read the data into a local buffer.
  std::size_t len = hdr.DataLength(time_len);
  std::vector<char> tbuf(len);
  if (zip->Read(tbuf.data(), len) != len) return false;
  const char* bp = tbuf.data();

  // Decode and validate the transitions.
  transitions_.reserve(hdr.timecnt + 2);
  transitions_.resize(hdr.timecnt);
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].unix_time = (time_len == 4) ? Decode32(bp) : Decode64(bp);
    bp += time_len;
    if (i != 0) {
      // Check that the transitions are ordered by time (as zic guarantees).
      if (!Transition::ByUnixTime()(transitions_[i - 1], transitions_[i]))
        return false;  // out of order
    }
  }
  bool seen_type_0 = false;
  for (std::size_t i = 0; i != hdr.timecnt; ++i) {
    transitions_[i].type_index = Decode8(bp++);
    if (transitions_[i].type_index >= hdr.typecnt) return false;
    if (transitions_[i].type_index == 0) seen_type_0 = true;
  }

  // Decode and validate the transition types.
  transition_types_.reserve(hdr.typecnt + 2);
  transition_types_.resize(hdr.typecnt);
  for (std::size_t i = 0; i != hdr.typecnt; ++i) {
    transition_types_[i].utc_offset =
        static_cast<std::int_least32_t>(Decode32(bp));
    if (transition_types_[i].utc_offset >= kSecsPerDay ||
        transition_types_[i].utc_offset <= -kSecsPerDay)
      return false;
    bp += 4;
    transition_types_[i].is_dst = (Decode8(bp++) != 0);
    transition_types_[i].abbr_index = Decode8(bp++);
    if (transition_types_[i].abbr_index >= hdr.charcnt) return false;
  }

  // Determine the before-first-transition type.
  default_transition_type_ = 0;
  if (seen_type_0 && hdr.timecnt != 0) {
    std::uint_fast8_t index = 0;
    if (transition_types_[0].is_dst) {
      index = transitions_[0].type_index;
      while (index != 0 && transition_types_[index].is_dst) --index;
    }
    while (index != hdr.typecnt && transition_types_[index].is_dst) ++index;
    if (index != hdr.typecnt) default_transition_type_ = index;
  }

  // Copy all the abbreviations.
  abbreviations_.reserve(hdr.charcnt + 10);
  abbreviations_.assign(bp, hdr.charcnt);
  bp += hdr.charcnt;

  // Skip the unused portions. We've already dispensed with leap-second
  // encoded zoneinfo. The ttisstd/ttisgmt indicators only apply when
  // interpreting a POSIX spec that does not include start/end rules, and
  // that isn't the case here (see "zic -p").
  bp += (time_len + 4) * hdr.leapcnt;  // leap-time + TAI-UTC
  bp += 1 * hdr.ttisstdcnt;            // UTC/local indicators
  bp += 1 * hdr.ttisutcnt;             // standard/wall indicators
  assert(bp == tbuf.data() + tbuf.size());

  future_spec_.clear();
  if (tzh.tzh_version[0] != '\0') {
    // Snarf up the NL-enclosed future POSIX spec. Note
    // that version '3' files utilize an extended format.
    auto get_char = [](ZoneInfoSource* azip) -> int {
      unsigned char ch;  // all non-EOF results are positive
      return (azip->Read(&ch, 1) == 1) ? ch : EOF;
    };
    if (get_char(zip) != '\n') return false;
    for (int c = get_char(zip); c != '\n'; c = get_char(zip)) {
      if (c == EOF) return false;
      future_spec_.push_back(static_cast<char>(c));
    }
  }

  // We don't check for EOF so that we're forwards compatible.

  // If we did not find version information during the standard loading
  // process (as of tzh_version '3' that is unsupported), then ask the
  // ZoneInfoSource for any out-of-bound version string it may be privy to.
  if (version_.empty()) {
    version_ = zip->Version();
  }

  // Ensure that there is always a transition in the first half of the
  // time line (the second half is handled below) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  if (transitions_.empty() || transitions_.front().unix_time >= 0) {
    Transition& tr(*transitions_.emplace(transitions_.begin()));
    tr.unix_time = -(1LL << 59);  // -18267312070-10-26T17:01:52+00:00
    tr.type_index = default_transition_type_;
  }

  // Extend the transitions using the future specification.
  if (!ExtendTransitions()) return false;

  // Ensure that there is always a transition in the second half of the
  // time line (the first half is handled above) so that the signed
  // difference between a civil_second and the civil_second of its
  // previous transition is always representable, without overflow.
  const Transition& last(transitions_.back());
  if (last.unix_time < 0) {
    const std::uint_fast8_t type_index = last.type_index;
    Transition& tr(*transitions_.emplace(transitions_.end()));
    tr.unix_time = 2147483647;  // 2038-01-19T03:14:07+00:00
    tr.type_index = type_index;
  }

  // Compute the local civil time for each transition and the preceding
  // second. These will be used for reverse conversions in MakeTime().
  const TransitionType* ttp = &transition_types_[default_transition_type_];
  for (std::size_t i = 0; i != transitions_.size(); ++i) {
    Transition& tr(transitions_[i]);
    tr.prev_civil_sec = LocalTime(tr.unix_time, *ttp).cs - 1;
    ttp = &transition_types_[tr.type_index];
    tr.civil_sec = LocalTime(tr.unix_time, *ttp).cs;
    if (i != 0) {
      // Check that the transitions are ordered by civil time. Essentially
      // this means that an offset change cannot cross another such change.
      // No one does this in practice, and we depend on it in MakeTime().
      if (!Transition::ByCivilTime()(transitions_[i - 1], tr))
        return false;  // out of order
    }
  }

  // Compute the maximum/minimum civil times that can be converted to a
  // time_point<seconds> for each of the zone's transition types.
  for (auto& tt : transition_types_) {
    tt.civil_max = LocalTime(seconds::max().count(), tt).cs;
    tt.civil_min = LocalTime(seconds::min().count(), tt).cs;
  }

  transitions_.shrink_to_fit();
  return true;
}